

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Select * sqlite3SelectDup(sqlite3 *db,Select *pDup,int flags)

{
  With *pWVar1;
  int iVar2;
  Select *pSVar3;
  ExprList *pEVar4;
  SrcList *pSVar5;
  Expr *pEVar6;
  With *pWVar7;
  Select *pSVar8;
  char *pcVar9;
  Window *pWVar10;
  Select **ppSVar11;
  Window **ppWVar12;
  long lVar13;
  Window *p;
  long lVar14;
  Window *local_50;
  Select *local_48;
  Select **local_40;
  Select *pRet;
  
  ppSVar11 = &pRet;
  pRet = (Select *)0x0;
  pSVar8 = (Select *)0x0;
  do {
    if ((pDup == (Select *)0x0) ||
       (pSVar3 = (Select *)sqlite3DbMallocRawNN(db,0x80), pSVar3 == (Select *)0x0)) {
      return pRet;
    }
    local_40 = ppSVar11;
    pEVar4 = sqlite3ExprListDup(db,pDup->pEList,flags);
    pSVar3->pEList = pEVar4;
    pSVar5 = sqlite3SrcListDup(db,pDup->pSrc,flags);
    pSVar3->pSrc = pSVar5;
    pEVar6 = sqlite3ExprDup(db,pDup->pWhere,flags);
    pSVar3->pWhere = pEVar6;
    pEVar4 = sqlite3ExprListDup(db,pDup->pGroupBy,flags);
    pSVar3->pGroupBy = pEVar4;
    pEVar6 = sqlite3ExprDup(db,pDup->pHaving,flags);
    pSVar3->pHaving = pEVar6;
    pEVar4 = sqlite3ExprListDup(db,pDup->pOrderBy,flags);
    pSVar3->pOrderBy = pEVar4;
    pSVar3->op = pDup->op;
    pSVar3->pNext = pSVar8;
    pSVar3->pPrior = (Select *)0x0;
    pEVar6 = sqlite3ExprDup(db,pDup->pLimit,flags);
    pSVar3->pLimit = pEVar6;
    pSVar3->iLimit = 0;
    pSVar3->iOffset = 0;
    pSVar3->selFlags = pDup->selFlags & 0xffffffdf;
    pSVar3->addrOpenEphm[0] = -1;
    pSVar3->addrOpenEphm[1] = -1;
    pSVar3->nSelectRow = pDup->nSelectRow;
    pWVar1 = pDup->pWith;
    if ((pWVar1 == (With *)0x0) ||
       (pWVar7 = (With *)sqlite3DbMallocZero(db,(long)(int)(pWVar1->nCte << 5 | 0x10)),
       pWVar7 == (With *)0x0)) {
      pWVar7 = (With *)0x0;
    }
    else {
      iVar2 = pWVar1->nCte;
      pWVar7->nCte = iVar2;
      lVar13 = 0x20;
      local_48 = pDup;
      for (lVar14 = 0; pDup = local_48, lVar14 < iVar2; lVar14 = lVar14 + 1) {
        pSVar8 = sqlite3SelectDup(db,*(Select **)((long)pWVar1->a + lVar13 + -0x10),0);
        *(Select **)((long)pWVar7->a + lVar13 + -0x10) = pSVar8;
        pEVar4 = sqlite3ExprListDup(db,*(ExprList **)((long)pWVar1->a + lVar13 + -0x18),0);
        *(ExprList **)((long)pWVar7->a + lVar13 + -0x18) = pEVar4;
        pcVar9 = sqlite3DbStrDup(db,*(char **)((long)(pWVar1->a + -1) + lVar13));
        *(char **)((long)(pWVar7->a + -1) + lVar13) = pcVar9;
        iVar2 = pWVar1->nCte;
        lVar13 = lVar13 + 0x20;
      }
    }
    ppSVar11 = &pSVar3->pPrior;
    pSVar3->pWith = pWVar7;
    pSVar3->pWin = (Window *)0x0;
    p = pDup->pWinDefn;
    local_50 = (Window *)0x0;
    ppWVar12 = &local_50;
    for (; p != (Window *)0x0; p = p->pNextWin) {
      pWVar10 = sqlite3WindowDup(db,(Expr *)0x0,p);
      *ppWVar12 = pWVar10;
      if (pWVar10 == (Window *)0x0) break;
      ppWVar12 = &pWVar10->pNextWin;
    }
    pSVar3->pWinDefn = local_50;
    pSVar3->selId = pDup->selId;
    *local_40 = pSVar3;
    pDup = pDup->pPrior;
    pSVar8 = pSVar3;
  } while( true );
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectDup(sqlite3 *db, Select *pDup, int flags){
  Select *pRet = 0;
  Select *pNext = 0;
  Select **pp = &pRet;
  Select *p;

  assert( db!=0 );
  for(p=pDup; p; p=p->pPrior){
    Select *pNew = sqlite3DbMallocRawNN(db, sizeof(*p) );
    if( pNew==0 ) break;
    pNew->pEList = sqlite3ExprListDup(db, p->pEList, flags);
    pNew->pSrc = sqlite3SrcListDup(db, p->pSrc, flags);
    pNew->pWhere = sqlite3ExprDup(db, p->pWhere, flags);
    pNew->pGroupBy = sqlite3ExprListDup(db, p->pGroupBy, flags);
    pNew->pHaving = sqlite3ExprDup(db, p->pHaving, flags);
    pNew->pOrderBy = sqlite3ExprListDup(db, p->pOrderBy, flags);
    pNew->op = p->op;
    pNew->pNext = pNext;
    pNew->pPrior = 0;
    pNew->pLimit = sqlite3ExprDup(db, p->pLimit, flags);
    pNew->iLimit = 0;
    pNew->iOffset = 0;
    pNew->selFlags = p->selFlags & ~SF_UsesEphemeral;
    pNew->addrOpenEphm[0] = -1;
    pNew->addrOpenEphm[1] = -1;
    pNew->nSelectRow = p->nSelectRow;
    pNew->pWith = withDup(db, p->pWith);
#ifndef SQLITE_OMIT_WINDOWFUNC
    pNew->pWin = 0;
    pNew->pWinDefn = sqlite3WindowListDup(db, p->pWinDefn);
#endif
    pNew->selId = p->selId;
    *pp = pNew;
    pp = &pNew->pPrior;
    pNext = pNew;
  }

  return pRet;
}